

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void setpause(global_State *g,l_mem estimate)

{
  long lVar1;
  
  lVar1 = (estimate / 100) * (long)g->gcpause;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(estimate / 100),0) <=
      (long)g->gcpause) {
    lVar1 = 0x7ffffffffffffffc;
  }
  luaE_setdebt(g,(g->GCdebt + g->totalbytes) - lVar1);
  return;
}

Assistant:

static void setpause (global_State *g, l_mem estimate) {
  l_mem debt, threshold;
  estimate = estimate / PAUSEADJ;  /* adjust 'estimate' */
  threshold = (g->gcpause < MAX_LMEM / estimate)  /* overflow? */
            ? estimate * g->gcpause  /* no overflow */
            : MAX_LMEM;  /* overflow; truncate to maximum */
  debt = -cast(l_mem, threshold - gettotalbytes(g));
  luaE_setdebt(g, debt);
}